

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor_test.cpp
# Opt level: O0

void __thiscall WrongMode::test_method(WrongMode *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  runtime_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]> local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  unique_ptr<Cryptor,_std::default_delete<Cryptor>_> local_50;
  basic_cstring<const_char> local_48 [2];
  basic_cstring<const_char> local_28;
  undefined1 local_18 [8];
  WrongMode *this_local;
  
  local_18 = (undefined1  [8])this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x2b,local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"WRONG",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Huffman",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Test message",&local_c1)
    ;
    Cryptor::cryptor_factory((Cryptor *)&local_50,&local_70,&local_98,&local_c0);
    std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::~unique_ptr(&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
                 ,100);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x2b,&local_e8);
      boost::test_tools::assertion_result::assertion_result(&local_100,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_120,prev,
                 (char (*) [53])"exception std::runtime_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
                 ,100);
      boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&ex,0x2b,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl(&local_120);
      boost::test_tools::assertion_result::~assertion_result(&local_100);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WrongMode) {

  BOOST_CHECK_THROW(Cryptor::cryptor_factory(
    "WRONG",
    "Huffman",
    "Test message"
  ), std::runtime_error);
}